

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

void png_image_memory_read(png_structp png_ptr,png_bytep out,size_t need)

{
  long lVar1;
  void *__src;
  ulong uVar2;
  
  if (png_ptr != (png_structp)0x0) {
    if (((long *)png_ptr->io_ptr == (long *)0x0) || (lVar1 = *png_ptr->io_ptr, lVar1 == 0)) {
      png_error(png_ptr,"invalid memory read");
    }
    __src = *(void **)(lVar1 + 0x18);
    if ((__src == (void *)0x0) || (uVar2 = *(ulong *)(lVar1 + 0x20), uVar2 < need)) {
      png_error(png_ptr,"read beyond end of data");
    }
    memcpy(out,__src,need);
    *(size_t *)(lVar1 + 0x18) = (long)__src + need;
    *(ulong *)(lVar1 + 0x20) = uVar2 - need;
  }
  return;
}

Assistant:

static void PNGCBAPI
png_image_memory_read(png_structp png_ptr, png_bytep out, size_t need)
{
   if (png_ptr != NULL)
   {
      png_imagep image = png_voidcast(png_imagep, png_ptr->io_ptr);
      if (image != NULL)
      {
         png_controlp cp = image->opaque;
         if (cp != NULL)
         {
            png_const_bytep memory = cp->memory;
            size_t size = cp->size;

            if (memory != NULL && size >= need)
            {
               memcpy(out, memory, need);
               cp->memory = memory + need;
               cp->size = size - need;
               return;
            }

            png_error(png_ptr, "read beyond end of data");
         }
      }

      png_error(png_ptr, "invalid memory read");
   }
}